

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O1

int __thiscall agg::bezier_arc_svg::init(bezier_arc_svg *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  uint uVar5;
  char in_DL;
  uint uVar6;
  ulong uVar7;
  undefined4 in_XMM0_Da;
  undefined4 uVar8;
  undefined4 in_XMM0_Db;
  undefined4 uVar9;
  double in_XMM1_Qa;
  double dVar10;
  double dVar11;
  double in_XMM2_Qa;
  double dVar12;
  double dVar13;
  double in_XMM3_Qa;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  double in_XMM5_Qa;
  double dVar14;
  double in_XMM6_Qa;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_138;
  trans_affine local_88;
  undefined1 local_58 [16];
  trans_affine local_48;
  
  cVar4 = (char)ctx;
  dVar1 = (double)CONCAT44(in_XMM4_Db,in_XMM4_Da);
  this[0xe0] = (bezier_arc_svg)0x1;
  local_138 = -in_XMM2_Qa;
  if (-in_XMM2_Qa <= in_XMM2_Qa) {
    local_138 = in_XMM2_Qa;
  }
  dVar14 = (double)(~-(ulong)(in_XMM3_Qa < 0.0) & (ulong)in_XMM3_Qa |
                   (ulong)-local_138 & -(ulong)(in_XMM3_Qa < 0.0));
  dVar12 = ((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) - in_XMM5_Qa) * 0.5;
  dVar10 = (in_XMM1_Qa - in_XMM6_Qa) * 0.5;
  dVar2 = cos((double)CONCAT44(in_XMM4_Db,in_XMM4_Da));
  dVar3 = sin(dVar1);
  dVar13 = dVar2 * dVar12 + dVar10 * dVar3;
  dVar15 = dVar10 * dVar2 - dVar12 * dVar3;
  dVar11 = local_138 * local_138;
  dVar10 = dVar14 * dVar14;
  dVar12 = (dVar15 * dVar15) / dVar10 + (dVar13 * dVar13) / dVar11;
  if (1.0 < dVar12) {
    dVar11 = SQRT(dVar12);
    dVar10 = dVar11;
    if (dVar12 < 0.0) {
      dVar10 = sqrt(dVar12);
    }
    local_138 = local_138 * dVar10;
    if (dVar12 < 0.0) {
      dVar11 = sqrt(dVar12);
    }
    dVar14 = dVar11 * dVar14;
    dVar11 = local_138 * local_138;
    dVar10 = dVar14 * dVar14;
    if (10.0 < dVar12) {
      this[0xe0] = (bezier_arc_svg)0x0;
    }
  }
  dVar16 = dVar15 * dVar15 * dVar11;
  dVar12 = dVar13 * dVar13 * dVar10;
  dVar12 = ((dVar11 * dVar10 - dVar16) - dVar12) / (dVar12 + dVar16);
  dVar10 = 0.0;
  if (0.0 <= dVar12) {
    dVar10 = dVar12;
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  if (cVar4 == in_DL) {
    dVar10 = -dVar10;
  }
  dVar16 = ((dVar15 * local_138) / dVar14) * dVar10;
  dVar10 = ((-dVar14 * dVar13) / local_138) * dVar10;
  dVar17 = (dVar13 - dVar16) / local_138;
  dVar12 = (dVar15 - dVar10) / dVar14;
  local_138 = (-dVar13 - dVar16) / local_138;
  dVar14 = (-dVar15 - dVar10) / dVar14;
  dVar11 = dVar17 * dVar17 + dVar12 * dVar12;
  local_58._8_8_ = 0;
  local_58._0_8_ = dVar11;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar13 = -1.0;
  if (-1.0 <= dVar17 / dVar11) {
    dVar13 = dVar17 / dVar11;
  }
  uVar8 = 0;
  uVar9 = 0x3ff00000;
  if (dVar13 <= 1.0) {
    uVar8 = SUB84(dVar13,0);
    uVar9 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  acos((double)CONCAT44(uVar9,uVar8));
  dVar11 = (double)local_58._0_8_ * (local_138 * local_138 + dVar14 * dVar14);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar11 = (dVar17 * local_138 + dVar12 * dVar14) / dVar11;
  dVar14 = -1.0;
  if (-1.0 <= dVar11) {
    dVar14 = dVar11;
  }
  uVar8 = 0;
  uVar9 = 0x3ff00000;
  if (dVar14 <= 1.0) {
    uVar8 = SUB84(dVar14,0);
    uVar9 = (undefined4)((ulong)dVar14 >> 0x20);
  }
  acos((double)CONCAT44(uVar9,uVar8));
  bezier_arc::init((bezier_arc *)this,ctx);
  dVar14 = cos(dVar1);
  dVar12 = sin(dVar1);
  dVar11 = sin(dVar1);
  local_88.sy = cos(dVar1);
  local_88.tx = 0.0;
  local_88.ty = 0.0;
  local_88.shx = -dVar11;
  local_48.sx = 1.0;
  local_48.shy = 0.0;
  local_48.shx = 0.0;
  local_48.sy = 1.0;
  local_88.sx = dVar14;
  local_88.shy = dVar12;
  local_48.tx = ((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) + in_XMM5_Qa) * 0.5 +
                dVar2 * dVar16 + -dVar3 * dVar10;
  local_48.ty = (in_XMM1_Qa + in_XMM6_Qa) * 0.5 + dVar3 * dVar16 + dVar2 * dVar10;
  trans_affine::multiply(&local_88,&local_48);
  uVar5 = *(uint *)(this + 4);
  uVar6 = uVar5 - 2;
  if (2 < uVar6) {
    uVar7 = 2;
    do {
      dVar1 = *(double *)(this + uVar7 * 8 + 8);
      *(double *)(this + uVar7 * 8 + 8) =
           dVar1 * local_88.sx + *(double *)(this + uVar7 * 8 + 0x10) * local_88.shx + local_88.tx;
      *(double *)(this + uVar7 * 8 + 0x10) =
           dVar1 * local_88.shy + *(double *)(this + uVar7 * 8 + 0x10) * local_88.sy + local_88.ty;
      uVar7 = uVar7 + 2;
    } while (uVar7 < uVar6);
  }
  *(ulong *)(this + 8) = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *(double *)(this + 0x10) = in_XMM1_Qa;
  if (2 < uVar5) {
    *(double *)(this + (ulong)uVar6 * 8 + 8) = in_XMM5_Qa;
    uVar5 = uVar5 - 1;
    *(double *)(this + (ulong)uVar5 * 8 + 8) = in_XMM6_Qa;
  }
  return uVar5;
}

Assistant:

void bezier_arc_svg::init(double x0, double y0, 
                              double rx, double ry, 
                              double angle,
                              bool large_arc_flag,
                              bool sweep_flag,
                              double x2, double y2)
    {
        m_radii_ok = true;

        if(rx < 0.0) rx = -rx;
        if(ry < 0.0) ry = -rx;

        // Calculate the middle point between 
        // the current and the final points
        //------------------------
        double dx2 = (x0 - x2) / 2.0;
        double dy2 = (y0 - y2) / 2.0;

        double cos_a = cos(angle);
        double sin_a = sin(angle);

        // Calculate (x1, y1)
        //------------------------
        double x1 =  cos_a * dx2 + sin_a * dy2;
        double y1 = -sin_a * dx2 + cos_a * dy2;

        // Ensure radii are large enough
        //------------------------
        double prx = rx * rx;
        double pry = ry * ry;
        double px1 = x1 * x1;
        double py1 = y1 * y1;

        // Check that radii are large enough
        //------------------------
        double radii_check = px1/prx + py1/pry;
        if(radii_check > 1.0) 
        {
            rx = sqrt(radii_check) * rx;
            ry = sqrt(radii_check) * ry;
            prx = rx * rx;
            pry = ry * ry;
            if(radii_check > 10.0) m_radii_ok = false;
        }

        // Calculate (cx1, cy1)
        //------------------------
        double sign = (large_arc_flag == sweep_flag) ? -1.0 : 1.0;
        double sq   = (prx*pry - prx*py1 - pry*px1) / (prx*py1 + pry*px1);
        double coef = sign * sqrt((sq < 0) ? 0 : sq);
        double cx1  = coef *  ((rx * y1) / ry);
        double cy1  = coef * -((ry * x1) / rx);

        //
        // Calculate (cx, cy) from (cx1, cy1)
        //------------------------
        double sx2 = (x0 + x2) / 2.0;
        double sy2 = (y0 + y2) / 2.0;
        double cx = sx2 + (cos_a * cx1 - sin_a * cy1);
        double cy = sy2 + (sin_a * cx1 + cos_a * cy1);

        // Calculate the start_angle (angle1) and the sweep_angle (dangle)
        //------------------------
        double ux =  (x1 - cx1) / rx;
        double uy =  (y1 - cy1) / ry;
        double vx = (-x1 - cx1) / rx;
        double vy = (-y1 - cy1) / ry;
        double p, n;

        // Calculate the angle start
        //------------------------
        n = sqrt(ux*ux + uy*uy);
        p = ux; // (1 * ux) + (0 * uy)
        sign = (uy < 0) ? -1.0 : 1.0;
        double v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double start_angle = sign * acos(v);

        // Calculate the sweep angle
        //------------------------
        n = sqrt((ux*ux + uy*uy) * (vx*vx + vy*vy));
        p = ux * vx + uy * vy;
        sign = (ux * vy - uy * vx < 0) ? -1.0 : 1.0;
        v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double sweep_angle = sign * acos(v);
        if(!sweep_flag && sweep_angle > 0) 
        {
            sweep_angle -= pi * 2.0;
        } 
        else 
        if (sweep_flag && sweep_angle < 0) 
        {
            sweep_angle += pi * 2.0;
        }

        // We can now build and transform the resulting arc
        //------------------------
        m_arc.init(0.0, 0.0, rx, ry, start_angle, sweep_angle);
        trans_affine mtx = trans_affine_rotation(angle);
        mtx *= trans_affine_translation(cx, cy);
        
        for(unsigned i = 2; i < m_arc.num_vertices()-2; i += 2)
        {
            mtx.transform(m_arc.vertices() + i, m_arc.vertices() + i + 1);
        }

        // We must make sure that the starting and ending points
        // exactly coincide with the initial (x0,y0) and (x2,y2)
        m_arc.vertices()[0] = x0;
        m_arc.vertices()[1] = y0;
        if(m_arc.num_vertices() > 2)
        {
            m_arc.vertices()[m_arc.num_vertices() - 2] = x2;
            m_arc.vertices()[m_arc.num_vertices() - 1] = y2;
        }
    }